

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

void bloaty::anon_unknown_0::DoReadELFSegments(RangeSink *sink,ReportSegmentsBy report_by)

{
  InputFile *pIVar1;
  ulong uVar2;
  string_view range;
  string_view range_00;
  string_view range_01;
  string_view range_02;
  string_view range_03;
  string_view range_04;
  string_view range_05;
  string_view range_06;
  string_view label;
  string_view label_00;
  string_view data;
  string_view label_01;
  string_view data_00;
  string_view label_02;
  bool bVar3;
  char *in_RCX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  char *pcVar4;
  char *pcVar5;
  uint32_t uVar6;
  Arg *pAVar7;
  string_view data_01;
  string_view data_02;
  string_view label_03;
  string_view label_04;
  string_view label_05;
  string_view label_06;
  string_view sVar8;
  string_view sVar9;
  string_view sVar10;
  string_view sVar11;
  string_view format;
  string_view format_00;
  MemberFile member;
  MemberReader reader;
  ElfFile elf;
  size_t in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char *pcVar12;
  RangeSink *local_1a8;
  RangeSink *local_1a0;
  MemberFile local_198;
  string local_158;
  ElfFile local_130;
  
  pIVar1 = sink->file_;
  local_1a8 = (RangeSink *)CONCAT44(local_1a8._4_4_,report_by);
  uVar2 = (pIVar1->data_)._M_len;
  local_1a0 = sink;
  if (7 < uVar2) {
    pAVar7 = (Arg *)(pIVar1->data_)._M_str;
    if ((pAVar7->piece_)._M_len == 0xa3e686372613c21) {
      local_158.field_2._8_8_ = &(pAVar7->piece_)._M_str;
      local_158.field_2._M_allocated_capacity = uVar2 - 8;
      local_198.filename._M_len = 0;
      local_198.filename._M_str = (char *)0x0;
      local_198.header._M_len = 0;
      local_198.header._M_str = (char *)0x0;
      local_198.contents._M_len = 0;
      local_198.contents._M_str = (char *)0x0;
      local_158._M_dataplus._M_p = (char *)0x0;
      local_158._M_string_length = 0;
      range._M_str = in_stack_fffffffffffffe50;
      range._M_len = in_stack_fffffffffffffe48;
      label_03._M_str = (char *)pAVar7;
      label_03._M_len = 8;
      in_RCX = (char *)0x8;
      MaybeAddFileRange((anon_unknown_0 *)sink,(char *)0xc,(RangeSink *)"[AR Headers]",label_03,
                        range);
      bVar3 = ArFile::MemberReader::ReadMember((MemberReader *)&local_158,&local_198);
      if (bVar3) {
        in_stack_fffffffffffffe50 = (char *)0x0;
        do {
          label._M_str = local_198.header._M_str;
          label._M_len = local_198.header._M_len;
          range_00._M_str = in_stack_fffffffffffffe50;
          range_00._M_len = in_stack_fffffffffffffe48;
          in_RCX = (char *)local_198.header._M_len;
          pcVar4 = local_198.header._M_str;
          MaybeAddFileRange((anon_unknown_0 *)sink,(char *)0xc,(RangeSink *)"[AR Headers]",label,
                            range_00);
          pcVar12 = (char *)local_198.contents._M_len;
          uVar6 = (uint32_t)pcVar4;
          if (local_198.file_type == kSymbolTable) {
            pcVar4 = (char *)0x11;
            pcVar12 = "[AR Symbol Table]";
LAB_0019b307:
            range_01._M_str = in_stack_fffffffffffffe50;
            range_01._M_len = in_stack_fffffffffffffe48;
            label_04._M_str = local_198.contents._M_str;
            label_04._M_len = local_198.contents._M_len;
            in_RCX = (char *)local_198.contents._M_len;
            MaybeAddFileRange((anon_unknown_0 *)sink,pcVar4,(RangeSink *)pcVar12,label_04,range_01);
          }
          else {
            if (local_198.file_type == kLongFilenameTable) {
              pcVar4 = (char *)0xc;
              pcVar12 = "[AR Headers]";
              goto LAB_0019b307;
            }
            if (local_198.file_type == kNormal) {
              label_01._M_str = local_198.contents._M_str;
              label_01._M_len = local_198.contents._M_len;
              data._M_str = local_198.contents._M_str;
              data._M_len = local_198.contents._M_len;
              ElfFile::ElfFile(&local_130,data);
              if (local_130.ok_ == true) {
                sVar9._M_str = in_RCX;
                sVar9._M_len = extraout_RDX_00;
                DoReadELFSegments::anon_class_16_2_a7d3e6c8::operator()
                          ((anon_class_16_2_a7d3e6c8 *)&local_1a8,&local_130,sVar9,uVar6);
                in_stack_fffffffffffffe50 = in_stack_fffffffffffffe50 + local_130.section_count_;
              }
              else {
                range_02._M_str = in_stack_fffffffffffffe50;
                range_02._M_len = in_stack_fffffffffffffe48;
                MaybeAddFileRange((anon_unknown_0 *)sink,(char *)0x18,
                                  (RangeSink *)"[AR Non-ELF Member File]",label_01,range_02);
                in_RCX = pcVar12;
              }
            }
          }
          bVar3 = ArFile::MemberReader::ReadMember((MemberReader *)&local_158,&local_198);
        } while (bVar3);
      }
    }
    else {
      data_01._M_str = (char *)pAVar7;
      data_01._M_len = uVar2;
      ElfFile::ElfFile(&local_130,data_01);
      if (local_130.ok_ == false) {
        local_198.filename._M_len = (size_t)(pIVar1->filename_)._M_dataplus._M_p;
        local_198._0_8_ = (pIVar1->filename_)._M_string_length;
        format._M_str = (char *)&local_198;
        format._M_len = (size_t)"Not an ELF or Archive file: $0";
        absl::Substitute_abi_cxx11_(&local_158,(absl *)0x1e,format,pAVar7);
        Throw(local_158._M_dataplus._M_p,0x2e2);
      }
      sVar8._M_str = in_RCX;
      sVar8._M_len = extraout_RDX;
      DoReadELFSegments::anon_class_16_2_a7d3e6c8::operator()
                ((anon_class_16_2_a7d3e6c8 *)&local_1a8,&local_130,sVar8,(uint32_t)pAVar7);
    }
    pIVar1 = sink->file_;
    uVar2 = (pIVar1->data_)._M_len;
    local_1a8 = sink;
    if (7 < uVar2) {
      pAVar7 = (Arg *)(pIVar1->data_)._M_str;
      if ((pAVar7->piece_)._M_len == 0xa3e686372613c21) {
        local_158.field_2._8_8_ = &(pAVar7->piece_)._M_str;
        local_158.field_2._M_allocated_capacity = uVar2 - 8;
        local_198.filename._M_len = 0;
        local_198.filename._M_str = (char *)0x0;
        local_198.header._M_len = 0;
        local_198.header._M_str = (char *)0x0;
        local_198.contents._M_len = 0;
        local_198.contents._M_str = (char *)0x0;
        local_158._M_dataplus._M_p = (pointer)0x0;
        local_158._M_string_length = 0;
        range_03._M_str = in_stack_fffffffffffffe50;
        range_03._M_len = in_stack_fffffffffffffe48;
        label_05._M_str = (char *)pAVar7;
        label_05._M_len = 8;
        MaybeAddFileRange((anon_unknown_0 *)sink,(char *)0xc,(RangeSink *)"[AR Headers]",label_05,
                          range_03);
        bVar3 = ArFile::MemberReader::ReadMember((MemberReader *)&local_158,&local_198);
        if (bVar3) {
          pcVar12 = (char *)0x0;
          do {
            label_00._M_str = local_198.header._M_str;
            label_00._M_len = local_198.header._M_len;
            range_04._M_str = pcVar12;
            range_04._M_len = in_stack_fffffffffffffe48;
            pcVar4 = (char *)local_198.header._M_len;
            pcVar5 = local_198.header._M_str;
            MaybeAddFileRange((anon_unknown_0 *)sink,(char *)0xc,(RangeSink *)"[AR Headers]",
                              label_00,range_04);
            uVar6 = (uint32_t)pcVar5;
            if (local_198.file_type == kSymbolTable) {
              pcVar5 = (char *)0x11;
              pcVar4 = "[AR Symbol Table]";
LAB_0019b4cb:
              range_05._M_str = pcVar12;
              range_05._M_len = in_stack_fffffffffffffe48;
              label_06._M_str = local_198.contents._M_str;
              label_06._M_len = local_198.contents._M_len;
              MaybeAddFileRange((anon_unknown_0 *)sink,pcVar5,(RangeSink *)pcVar4,label_06,range_05)
              ;
            }
            else {
              if (local_198.file_type == kLongFilenameTable) {
                pcVar5 = (char *)0xc;
                pcVar4 = "[AR Headers]";
                goto LAB_0019b4cb;
              }
              if (local_198.file_type == kNormal) {
                label_02._M_str = local_198.contents._M_str;
                label_02._M_len = local_198.contents._M_len;
                data_00._M_str = local_198.contents._M_str;
                data_00._M_len = local_198.contents._M_len;
                ElfFile::ElfFile(&local_130,data_00);
                if (local_130.ok_ == true) {
                  sVar11._M_str = pcVar4;
                  sVar11._M_len = extraout_RDX_02;
                  DoReadELFSegments::anon_class_8_1_89918b91::operator()
                            ((anon_class_8_1_89918b91 *)&local_1a8,&local_130,sVar11,uVar6);
                  pcVar12 = pcVar12 + local_130.section_count_;
                }
                else {
                  range_06._M_str = pcVar12;
                  range_06._M_len = in_stack_fffffffffffffe48;
                  MaybeAddFileRange((anon_unknown_0 *)sink,(char *)0x18,
                                    (RangeSink *)"[AR Non-ELF Member File]",label_02,range_06);
                }
              }
            }
            bVar3 = ArFile::MemberReader::ReadMember((MemberReader *)&local_158,&local_198);
          } while (bVar3);
        }
      }
      else {
        data_02._M_str = (char *)pAVar7;
        data_02._M_len = uVar2;
        ElfFile::ElfFile(&local_130,data_02);
        if (local_130.ok_ == false) {
          local_198.filename._M_len = (size_t)(pIVar1->filename_)._M_dataplus._M_p;
          local_198._0_8_ = (pIVar1->filename_)._M_string_length;
          format_00._M_str = (char *)&local_198;
          format_00._M_len = (size_t)"Not an ELF or Archive file: $0";
          absl::Substitute_abi_cxx11_(&local_158,(absl *)0x1e,format_00,pAVar7);
          Throw(local_158._M_dataplus._M_p,0x2e2);
        }
        sVar10._M_str = in_RCX;
        sVar10._M_len = extraout_RDX_01;
        DoReadELFSegments::anon_class_8_1_89918b91::operator()
                  ((anon_class_8_1_89918b91 *)&local_1a8,&local_130,sVar10,(uint32_t)pAVar7);
      }
      return;
    }
  }
  Throw("region out-of-bounds",0x5d);
}

Assistant:

const ElfFile& elf() const { return *elf_; }